

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  uint32 *puVar1;
  ScriptContext *pSVar2;
  RecyclableObject *pRVar3;
  
  pSVar2 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != SnapHeapArgumentsObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
  if ((char)puVar1[1] == '\0') {
    if (*(TTD_PTR_ID *)(puVar1 + 2) == 0) {
      TTDAbort_unrecoverable_error("That won\'t work!");
    }
    pRVar3 = InflateMap::LookupObject(inflator,*(TTD_PTR_ID *)(puVar1 + 2));
  }
  else {
    pRVar3 = (RecyclableObject *)0x0;
  }
  pRVar3 = Js::JavascriptLibrary::CreateHeapArguments_TTD
                     ((pSVar2->super_ScriptContextBase).javascriptLibrary,*puVar1,puVar1[4],
                      (ActivationObject *)pRVar3,*(byte **)(puVar1 + 6));
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapHeapArgumentsInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            SnapHeapArgumentsInfo* argsInfo = SnapObjectGetAddtlInfoAs<SnapHeapArgumentsInfo*, SnapObjectType::SnapHeapArgumentsObject>(snpObject);

            Js::RecyclableObject* activationObj = nullptr;
            if(argsInfo->IsFrameNullPtr)
            {
                activationObj = nullptr;
            }
            else
            {
                TTDAssert(argsInfo->FrameObject != TTD_INVALID_PTR_ID, "That won't work!");

                activationObj = inflator->LookupObject(argsInfo->FrameObject);
            }

            return  ctx->GetLibrary()->CreateHeapArguments_TTD(argsInfo->NumOfArguments, argsInfo->FormalCount, static_cast<Js::ActivationObject*>(activationObj), argsInfo->DeletedArgFlags);
        }